

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v5::
     visit_format_arg<testing::StrictMock<mock_visitor<unsigned_int>>&,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (StrictMock<mock_visitor<unsigned_int>_> *vis,
               basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               *arg)

{
  basic_string_view<char> bVar1;
  handle hVar2;
  undefined8 uVar3;
  custom_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *in_RSI;
  long in_RDI;
  undefined2 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6a;
  uint in_stack_ffffffffffffff6c;
  bool bVar4;
  undefined2 in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff72;
  handle local_50;
  basic_string_view<char> local_38 [3];
  
  bVar4 = SUB41(in_stack_ffffffffffffff6c >> 0x18,0);
  switch(*(undefined4 *)&in_RSI[1].value) {
  case 0:
  default:
    mock_visitor<unsigned_int>::operator()((mock_visitor<unsigned_int> *)(in_RDI + 8));
    break;
  case 1:
    uVar3 = __cxa_allocate_exception(0x10);
    assertion_failure::assertion_failure
              ((assertion_failure *)CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,
                                CONCAT22(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)));
    __cxa_throw(uVar3,&assertion_failure::typeinfo,assertion_failure::~assertion_failure);
  case 2:
    mock_visitor<unsigned_int>::operator()
              ((mock_visitor<unsigned_int> *)
               CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c);
    break;
  case 3:
    mock_visitor<unsigned_int>::operator()
              ((mock_visitor<unsigned_int> *)
               CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
               in_stack_ffffffffffffff6c);
    break;
  case 4:
    mock_visitor<unsigned_int>::operator()
              ((mock_visitor<unsigned_int> *)
               CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
               CONCAT44(in_stack_ffffffffffffff6c,
                        CONCAT22(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)));
    break;
  case 5:
    mock_visitor<unsigned_int>::operator()
              ((mock_visitor<unsigned_int> *)
               CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
               CONCAT44(in_stack_ffffffffffffff6c,
                        CONCAT22(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)));
    break;
  case 6:
    mock_visitor<unsigned_int>::operator()
              ((mock_visitor<unsigned_int> *)
               CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),bVar4);
    break;
  case 7:
    mock_visitor<unsigned_int>::operator()
              ((mock_visitor<unsigned_int> *)
               CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),bVar4);
    break;
  case 8:
    mock_visitor<unsigned_int>::operator()
              ((mock_visitor<unsigned_int> *)
               CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
               (double)CONCAT44(in_stack_ffffffffffffff6c,
                                CONCAT22(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)));
    break;
  case 9:
    mock_visitor<unsigned_int>::operator()
              ((mock_visitor<unsigned_int> *)
               CONCAT62(in_stack_ffffffffffffff72,(short)((unkuint10)*(unkbyte10 *)in_RSI >> 0x40)),
               (longdouble)CONCAT28((short)*(unkbyte10 *)in_RSI,0x14aee7));
    break;
  case 10:
    mock_visitor<unsigned_int>::operator()
              ((mock_visitor<unsigned_int> *)
               CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
               (char *)CONCAT44(in_stack_ffffffffffffff6c,
                                CONCAT22(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)));
    break;
  case 0xb:
    basic_string_view<char>::basic_string_view
              (local_38,(char *)in_RSI->value,(size_t)in_RSI->format);
    bVar1.data_._2_2_ = in_stack_ffffffffffffff6a;
    bVar1.data_._0_2_ = in_stack_ffffffffffffff68;
    bVar1.data_._4_4_ = in_stack_ffffffffffffff6c;
    bVar1.size_._0_2_ = in_stack_ffffffffffffff70;
    bVar1.size_._2_6_ = in_stack_ffffffffffffff72;
    mock_visitor<unsigned_int>::operator()((mock_visitor<unsigned_int> *)0x14af53,bVar1);
    break;
  case 0xc:
    mock_visitor<unsigned_int>::operator()
              ((mock_visitor<unsigned_int> *)
               CONCAT62(in_stack_ffffffffffffff72,in_stack_ffffffffffffff70),
               (void *)CONCAT44(in_stack_ffffffffffffff6c,
                                CONCAT22(in_stack_ffffffffffffff6a,in_stack_ffffffffffffff68)));
    break;
  case 0xd:
    basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::handle::handle(&local_50,*in_RSI);
    hVar2.custom_.value._2_2_ = in_stack_ffffffffffffff6a;
    hVar2.custom_.value._0_2_ = in_stack_ffffffffffffff68;
    hVar2.custom_.value._4_4_ = in_stack_ffffffffffffff6c;
    hVar2.custom_.format._0_2_ = in_stack_ffffffffffffff70;
    hVar2.custom_.format._2_6_ = in_stack_ffffffffffffff72;
    mock_visitor<unsigned_int>::operator()((mock_visitor<unsigned_int> *)0x14afc8,hVar2);
  }
  return;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}